

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

translator_type * __thiscall
cs::translator_type::add_method
          (translator_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *grammar
          ,method_base *method)

{
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_RDX;
  translator_type *in_RDI;
  shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>
  *in_stack_ffffffffffffffc8;
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  *in_stack_ffffffffffffffd0;
  method_base **in_stack_ffffffffffffffe0;
  
  std::
  make_shared<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,cs::method_base*&>
            (in_RDX,in_stack_ffffffffffffffe0);
  std::__cxx11::
  list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
  ::
  emplace_back<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>
  ::~shared_ptr((shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>
                 *)0x19153f);
  return in_RDI;
}

Assistant:

translator_type &add_method(const std::deque<token_base *> &grammar, method_base *method)
		{
			m_data.emplace_back(std::make_shared<data_type>(grammar, method));
			return *this;
		}